

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeSORegImmOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  DVar2 = DecodeGPRRegisterClass(Inst,Val & 0xf,Address,Decoder);
  if ((DVar2 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  uVar3 = Val >> 7 & 0x1f;
  switch(Val >> 5 & 3) {
  case 0:
    iVar4 = 2;
    break;
  case 1:
    iVar4 = 3;
    break;
  case 2:
    iVar4 = 1;
    break;
  case 3:
    iVar4 = 4;
    bVar1 = true;
    goto LAB_0014e29d;
  }
  bVar1 = false;
LAB_0014e29d:
  iVar5 = 5;
  if (!bVar1) {
    iVar5 = iVar4;
  }
  if (uVar3 != 0) {
    iVar5 = iVar4;
  }
  MCOperand_CreateImm0(Inst,(ulong)(iVar5 + uVar3 * 8));
  return DVar2;
}

Assistant:

static DecodeStatus DecodeSORegImmOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;
	unsigned Op;
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);

	// Register-immediate
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	if (Shift == ARM_AM_ror && imm == 0)
		Shift = ARM_AM_rrx;

	Op = Shift | (imm << 3);
	MCOperand_CreateImm0(Inst, Op);

	return S;
}